

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa_verification.c
# Opt level: O1

aspa_verification_result
aspa_verify_as_path(aspa_table *aspa_table,uint32_t *as_path,size_t len,aspa_direction direction)

{
  long lVar1;
  ulong uVar2;
  aspa_hop_result aVar3;
  aspa_hop_result aVar4;
  byte bVar5;
  bool bVar6;
  aspa_verification_result aVar7;
  ulong uVar8;
  size_t sVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (direction == ASPA_DOWNSTREAM) {
    if (aspa_table == (aspa_table *)0x0) goto LAB_0010dfbe;
    aVar7 = ASPA_AS_PATH_VALID;
    if (len < 3) goto LAB_0010e134;
    pthread_rwlock_rdlock((pthread_rwlock_t *)aspa_table);
    do {
      uVar10 = len;
      len = uVar10 - 1;
      if (len == 0) {
        aVar3 = ASPA_PROVIDER_PLUS;
        len = 0;
        break;
      }
      aVar3 = aspa_check_hop(aspa_table,as_path[len],as_path[uVar10 - 2]);
    } while (aVar3 == ASPA_PROVIDER_PLUS);
    uVar2 = 1;
    do {
      uVar8 = uVar2;
      if (uVar10 == uVar8) {
        aVar4 = ASPA_PROVIDER_PLUS;
        break;
      }
      aVar4 = aspa_check_hop(aspa_table,as_path[uVar8 - 1],as_path[uVar8]);
      uVar2 = uVar8 + 1;
    } while (aVar4 == ASPA_PROVIDER_PLUS);
    if (len < uVar8 - 1) {
      __assert_fail("l <= r",
                    "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa_verification.c"
                    ,0xb8,
                    "enum aspa_verification_result aspa_verify_as_path_downstream(struct aspa_table *, uint32_t *, size_t)"
                   );
    }
    if (uVar10 - uVar8 < 2) goto LAB_0010e042;
    bVar6 = true;
    if (aVar3 != ASPA_NOT_PROVIDER_PLUS) {
      do {
        bVar6 = false;
        if (len <= uVar8) goto LAB_0010e0dc;
        uVar10 = len - 1;
        aVar3 = aspa_check_hop(aspa_table,as_path[len],as_path[len - 1]);
        len = uVar10;
      } while (aVar3 != ASPA_NOT_PROVIDER_PLUS);
      bVar6 = true;
    }
LAB_0010e0dc:
    if (!bVar6) {
LAB_0010e129:
      pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
      aVar7 = ASPA_AS_PATH_UNKNOWN;
      goto LAB_0010e134;
    }
    if (aVar4 != ASPA_NOT_PROVIDER_PLUS) {
      do {
        bVar6 = false;
        if (len <= uVar8) goto LAB_0010e116;
        aVar3 = aspa_check_hop(aspa_table,as_path[uVar8],as_path[uVar8 + 1]);
        uVar8 = uVar8 + 1;
      } while (aVar3 != ASPA_NOT_PROVIDER_PLUS);
      bVar6 = true;
LAB_0010e116:
      if (!bVar6) goto LAB_0010e129;
    }
    pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
  }
  else {
    aVar7 = ASPA_AS_PATH_UNKNOWN;
    if (direction != ASPA_UPSTREAM) goto LAB_0010e134;
    if (aspa_table != (aspa_table *)0x0) {
      aVar7 = ASPA_AS_PATH_VALID;
      if (len < 2) goto LAB_0010e134;
      pthread_rwlock_rdlock((pthread_rwlock_t *)aspa_table);
      do {
        sVar9 = len;
        if (sVar9 == 1) {
          aVar3 = ASPA_PROVIDER_PLUS;
          len = 0;
          break;
        }
        aVar3 = aspa_check_hop(aspa_table,as_path[sVar9 - 1],as_path[sVar9 - 2]);
        len = sVar9 - 1;
      } while (aVar3 == ASPA_PROVIDER_PLUS);
      if (sVar9 != 1) {
        aVar7 = ASPA_AS_PATH_INVALID;
        if (aVar3 != ASPA_NOT_PROVIDER_PLUS) {
          do {
            bVar5 = 0;
            if (len == 0) goto LAB_0010e089;
            aVar3 = aspa_check_hop(aspa_table,as_path[len],as_path[len - 1]);
            len = len - 1;
          } while (aVar3 != ASPA_NOT_PROVIDER_PLUS);
          bVar5 = 1;
LAB_0010e089:
          aVar7 = (aspa_verification_result)bVar5;
        }
        pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
        goto LAB_0010e134;
      }
LAB_0010e042:
      pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
      aVar7 = ASPA_AS_PATH_VALID;
      goto LAB_0010e134;
    }
LAB_0010dfbe:
    lrtr_dbg("ASPA: TRYING TO VALIDATE A AS_PATH BUT NO ASPA TABLE INITIALIZED");
  }
  aVar7 = ASPA_AS_PATH_INVALID;
LAB_0010e134:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return aVar7;
  }
  __stack_chk_fail();
}

Assistant:

aspa_verification_result aspa_verify_as_path(struct aspa_table *aspa_table, uint32_t as_path[],
								size_t len, enum aspa_direction direction)
{
	switch (direction) {
	case ASPA_UPSTREAM:
		return aspa_verify_as_path_upstream(aspa_table, as_path, len);
	case ASPA_DOWNSTREAM:
		return aspa_verify_as_path_downstream(aspa_table, as_path, len);
	}

	return ASPA_AS_PATH_UNKNOWN;
}